

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPrT.cpp
# Opt level: O2

void __thiscall OpenMD::NPrT::loadEta(NPrT *this)

{
  RectMatrix<double,_3U,_3U> RStack_58;
  
  Snapshot::getBarostat
            ((Mat3x3d *)&RStack_58,
             (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.snap);
  RectMatrix<double,_3U,_3U>::operator=((RectMatrix<double,_3U,_3U> *)&this->eta,&RStack_58);
  return;
}

Assistant:

void NPrT::loadEta() {
    eta = snap->getBarostat();

    // if (!eta.isDiagonal()) {
    //    snprintf( painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
    //             "NPrT error: the diagonal elements of eta matrix are not the
    //             same or etaMat is not a diagonal matrix");
    //    painCave.isFatal = 1;
    //    simError();
    //}
  }